

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarClockGate(Abc_Ntk_t *pNtk,Abc_Ntk_t *pCare,Cgt_Par_t *pPars)

{
  Aig_Man_t *pAig;
  Aig_Man_t *pCare_00;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  
  pAig = Abc_NtkToDar(pNtk,0,1);
  if (pAig == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (pCare == (Abc_Ntk_t *)0x0) {
    pCare_00 = (Aig_Man_t *)0x0;
  }
  else {
    pAVar1 = (Abc_Ntk_t *)0x0;
    pCare_00 = Abc_NtkToDar(pCare,0,0);
    if (pCare_00 == (Aig_Man_t *)0x0) goto LAB_0024fb33;
  }
  pMan = Cgt_ClockGating(pAig,pCare_00,pPars);
  Aig_ManStop(pAig);
  if (pCare_00 != (Aig_Man_t *)0x0) {
    Aig_ManStop(pCare_00);
  }
  if (pMan == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  pAVar1 = Abc_NtkFromDar(pNtk,pMan);
  pAig = pMan;
LAB_0024fb33:
  Aig_ManStop(pAig);
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarClockGate( Abc_Ntk_t * pNtk, Abc_Ntk_t * pCare, Cgt_Par_t * pPars )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan1, * pMan2 = NULL, * pMan;
    pMan1 = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan1 == NULL )
        return NULL;
    if ( pCare )
    {
        pMan2 = Abc_NtkToDar( pCare, 0, 0 );
        if ( pMan2 == NULL )
        {
            Aig_ManStop( pMan1 );
            return NULL;
        }
    }
    pMan = Cgt_ClockGating( pMan1, pMan2, pPars );
    Aig_ManStop( pMan1 );
    if ( pMan2 )
        Aig_ManStop( pMan2 );
    if ( pMan == NULL )
        return NULL;
    pNtkAig = Abc_NtkFromDar( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}